

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv__dup2_cloexec(int oldfd,int newfd)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if (uv__dup2_cloexec_no_dup3 == '\0') {
    do {
      iVar1 = uv__dup3(oldfd,newfd,0x80000);
      if (iVar1 != -1) {
        return iVar1;
      }
      piVar3 = __errno_location();
      iVar1 = *piVar3;
    } while (iVar1 == 0x10);
    if (iVar1 != 0x26) goto LAB_004c0761;
    uv__dup2_cloexec_no_dup3 = '\x01';
  }
  do {
    iVar1 = dup2(oldfd,newfd);
    if (iVar1 != -1) {
      iVar2 = uv__cloexec_ioctl(newfd,1);
      if (iVar2 == 0) {
        return iVar1;
      }
      uv__close(newfd);
      return iVar2;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
  } while (iVar1 == 0x10);
LAB_004c0761:
  return -iVar1;
}

Assistant:

int uv__dup2_cloexec(int oldfd, int newfd) {
  int r;
#if (defined(__FreeBSD__) && __FreeBSD__ >= 10) || defined(__NetBSD__)
  r = dup3(oldfd, newfd, O_CLOEXEC);
  if (r == -1)
    return UV__ERR(errno);
  return r;
#elif defined(__FreeBSD__) && defined(F_DUP2FD_CLOEXEC)
  r = fcntl(oldfd, F_DUP2FD_CLOEXEC, newfd);
  if (r != -1)
    return r;
  if (errno != EINVAL)
    return UV__ERR(errno);
  /* Fall through. */
#elif defined(__linux__)
  static int no_dup3;
  if (!no_dup3) {
    do
      r = uv__dup3(oldfd, newfd, UV__O_CLOEXEC);
    while (r == -1 && errno == EBUSY);
    if (r != -1)
      return r;
    if (errno != ENOSYS)
      return UV__ERR(errno);
    /* Fall through. */
    no_dup3 = 1;
  }
#endif
  {
    int err;
    do
      r = dup2(oldfd, newfd);
#if defined(__linux__)
    while (r == -1 && errno == EBUSY);
#else
    while (0);  /* Never retry. */
#endif

    if (r == -1)
      return UV__ERR(errno);

    err = uv__cloexec(newfd, 1);
    if (err) {
      uv__close(newfd);
      return err;
    }

    return r;
  }
}